

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::find_position<int>
          (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,int *key)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  bool bVar5;
  const_reference piVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  
  sVar4 = (this->table).settings.table_size;
  uVar9 = (ulong)*key;
  piVar1 = &(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
            .num_hashes_;
  *piVar1 = *piVar1 + 1;
  uVar10 = 0xffffffffffffffff;
  lVar11 = 1;
  do {
    uVar9 = uVar9 & sVar4 - 1;
    uVar7 = (int)uVar9 + (int)(uVar9 / 0x30) * -0x30;
    if (((this->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar9 / 0x30].bitmap[uVar7 >> 3] >> (uVar7 & 7) &
        1) == 0) {
      uVar8 = uVar9;
      if (uVar10 != 0xffffffffffffffff) {
        uVar8 = uVar10;
      }
      uVar9 = 0xffffffffffffffff;
LAB_0062a6ba:
      pVar12.second = uVar8;
      pVar12.first = uVar9;
      return pVar12;
    }
    bVar5 = test_deleted(this,uVar9);
    if (bVar5) {
      if (uVar10 == 0xffffffffffffffff) {
        uVar10 = uVar9;
      }
    }
    else {
      piVar6 = sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::unsafe_get(&this->table,uVar9);
      iVar2 = *key;
      iVar3 = *piVar6;
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar2 == iVar3) {
        uVar8 = 0xffffffffffffffff;
        goto LAB_0062a6ba;
      }
    }
    uVar9 = uVar9 + lVar11;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }